

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O1

char * helicsInputGetName(HelicsInput inp)

{
  HelicsInput pvVar1;
  string *psVar2;
  
  pvVar1 = (HelicsInput)0x0;
  if ((inp != (HelicsInput)0x0) && (*inp == 0x3456e052)) {
    pvVar1 = inp;
  }
  if (pvVar1 == (HelicsInput)0x0) {
    psVar2 = &gHelicsEmptyStr_abi_cxx11_;
  }
  else {
    psVar2 = helics::Interface::getName_abi_cxx11_(*(Interface **)((long)pvVar1 + 0x18));
  }
  return (psVar2->_M_dataplus)._M_p;
}

Assistant:

const char* helicsInputGetName(HelicsInput inp)
{
    auto* inpObj = verifyInput(inp, nullptr);
    if (inpObj == nullptr) {
        return gHelicsEmptyStr.c_str();
    }

    try {
        const std::string& key = inpObj->inputPtr->getName();
        return key.c_str();
    }
    // LCOV_EXCL_START
    catch (...) {
        return gHelicsEmptyStr.c_str();
    }
    // LCOV_EXCL_STOP
}